

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O1

void __thiscall Potassco::ProgramOptions::SyntaxError::~SyntaxError(SyntaxError *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_Error = &PTR__SyntaxError_0012c950;
  pcVar1 = (this->key_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key_).field_2) {
    operator_delete(pcVar1);
  }
  std::logic_error::~logic_error((logic_error *)this);
  return;
}

Assistant:

~SyntaxError() throw () {}